

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef lj_opt_cselim(jit_State *J,IRRef lim)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  IRIns *pIVar4;
  byte bVar5;
  ulong uVar6;
  
  uVar1 = J->chain[(J->fold).ins.field_1.o];
  if (lim < uVar1) {
    pIVar4 = (J->cur).ir;
    do {
      if (pIVar4[uVar1].field_1.op12 == (J->fold).ins.field_1.op12) {
        return (uint)uVar1;
      }
      uVar1 = *(ushort *)((long)pIVar4 + (ulong)uVar1 * 8 + 6);
    } while (lim < uVar1);
  }
  uVar2 = (J->cur).nins;
  uVar6 = (ulong)uVar2;
  if (J->irtoplim <= uVar2) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar2 + 1;
  pIVar4 = (J->cur).ir;
  bVar5 = (J->fold).ins.field_1.o;
  *(IRRef1 *)((long)pIVar4 + uVar6 * 8 + 6) = J->chain[bVar5];
  J->chain[bVar5] = (IRRef1)uVar2;
  *(byte *)((long)pIVar4 + uVar6 * 8 + 5) = bVar5;
  pIVar4[uVar6].field_0.op1 = (J->fold).ins.field_0.op1;
  *(IRRef1 *)((long)pIVar4 + uVar6 * 8 + 2) = (J->fold).ins.field_0.op2;
  iVar3 = *(int *)((long)&(J->fold).ins + 4);
  bVar5 = (byte)iVar3;
  (J->guardemit).irt = (J->guardemit).irt | bVar5;
  *(byte *)((long)pIVar4 + uVar6 * 8 + 4) = bVar5;
  return iVar3 * 0x1000000 + uVar2;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cselim(jit_State *J, IRRef lim)
{
  IRRef ref = J->chain[fins->o];
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  while (ref > lim) {
    if (IR(ref)->op12 == op12)
      return ref;
    ref = IR(ref)->prev;
  }
  return lj_ir_emit(J);
}